

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderIndexingTests.cpp
# Opt level: O0

ShaderIndexingCase *
deqp::createVaryingArrayCase
          (Context *context,char *caseName,char *description,GLSLVersion glslVersion,
          DataType varType,IndexAccessType vertAccess,IndexAccessType fragAccess)

{
  char *pcVar1;
  ostream *poVar2;
  ShaderEvalFunc evalFunc_00;
  ShaderIndexingCase *this;
  char *fragShaderSource;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_basic_string<char>_>_>::value,_pair<iterator,_bool>_>
  _Var3;
  ShaderEvalFunc evalFunc;
  string fragmentShaderSource;
  string vertexShaderSource;
  string local_660 [32];
  string local_640;
  undefined1 local_620 [8];
  StringTemplate fragTemplate;
  string local_5f8 [32];
  string local_5d8;
  undefined1 local_5b8 [8];
  StringTemplate vertTemplate;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_588;
  _Base_ptr local_548;
  undefined1 local_540;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_538;
  _Base_ptr local_4f8;
  undefined1 local_4f0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4e8;
  _Base_ptr local_4a8;
  undefined1 local_4a0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_498;
  _Base_ptr local_458;
  undefined1 local_450;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_448;
  _Base_ptr local_408;
  undefined1 local_400;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3f8;
  _Base_ptr local_3b8;
  undefined1 local_3b0;
  char *local_3a8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3a0;
  undefined1 local_360 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  ostringstream frag;
  undefined1 local_1a8 [8];
  ostringstream vtx;
  IndexAccessType vertAccess_local;
  DataType varType_local;
  GLSLVersion glslVersion_local;
  char *description_local;
  char *caseName_local;
  Context *context_local;
  
  vtx._372_4_ = vertAccess;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  pcVar1 = glu::getGLSLVersionDeclaration(glslVersion);
  poVar2 = std::operator<<((ostream *)local_1a8,pcVar1);
  std::operator<<(poVar2,"\n");
  std::operator<<((ostream *)local_1a8,"in highp vec4 a_position;\n");
  std::operator<<((ostream *)local_1a8,"in highp vec4 a_coords;\n");
  if (vtx._372_4_ == 1) {
    std::operator<<((ostream *)local_1a8,"uniform mediump int ui_zero, ui_one, ui_two, ui_three;\n")
    ;
  }
  else if (vtx._372_4_ == 3) {
    std::operator<<((ostream *)local_1a8,"uniform mediump int ui_four;\n");
  }
  std::operator<<((ostream *)local_1a8,"out ${PRECISION} ${VAR_TYPE} var[${ARRAY_LEN}];\n");
  std::operator<<((ostream *)local_1a8,"\n");
  std::operator<<((ostream *)local_1a8,"void main()\n");
  std::operator<<((ostream *)local_1a8,"{\n");
  std::operator<<((ostream *)local_1a8,"    gl_Position = a_position;\n");
  if (vtx._372_4_ == 0) {
    std::operator<<((ostream *)local_1a8,"    var[0] = ${VAR_TYPE}(a_coords);\n");
    std::operator<<((ostream *)local_1a8,"    var[1] = ${VAR_TYPE}(a_coords) * 0.5;\n");
    std::operator<<((ostream *)local_1a8,"    var[2] = ${VAR_TYPE}(a_coords) * 0.25;\n");
    std::operator<<((ostream *)local_1a8,"    var[3] = ${VAR_TYPE}(a_coords) * 0.125;\n");
  }
  else if (vtx._372_4_ == 1) {
    std::operator<<((ostream *)local_1a8,"    var[ui_zero]  = ${VAR_TYPE}(a_coords);\n");
    std::operator<<((ostream *)local_1a8,"    var[ui_one]   = ${VAR_TYPE}(a_coords) * 0.5;\n");
    std::operator<<((ostream *)local_1a8,"    var[ui_two]   = ${VAR_TYPE}(a_coords) * 0.25;\n");
    std::operator<<((ostream *)local_1a8,"    var[ui_three] = ${VAR_TYPE}(a_coords) * 0.125;\n");
  }
  else if (vtx._372_4_ == 2) {
    std::operator<<((ostream *)local_1a8,
                    "    ${PRECISION} ${VAR_TYPE} coords = ${VAR_TYPE}(a_coords);\n");
    std::operator<<((ostream *)local_1a8,"    for (int i = 0; i < 4; i++)\n");
    std::operator<<((ostream *)local_1a8,"    {\n");
    std::operator<<((ostream *)local_1a8,"        var[i] = ${VAR_TYPE}(coords);\n");
    std::operator<<((ostream *)local_1a8,"        coords = coords * 0.5;\n");
    std::operator<<((ostream *)local_1a8,"    }\n");
  }
  else {
    std::operator<<((ostream *)local_1a8,
                    "    ${PRECISION} ${VAR_TYPE} coords = ${VAR_TYPE}(a_coords);\n");
    std::operator<<((ostream *)local_1a8,"    for (int i = 0; i < ui_four; i++)\n");
    std::operator<<((ostream *)local_1a8,"    {\n");
    std::operator<<((ostream *)local_1a8,"        var[i] = ${VAR_TYPE}(coords);\n");
    std::operator<<((ostream *)local_1a8,"        coords = coords * 0.5;\n");
    std::operator<<((ostream *)local_1a8,"    }\n");
  }
  std::operator<<((ostream *)local_1a8,"}\n");
  std::__cxx11::ostringstream::ostringstream
            ((ostringstream *)&params._M_t._M_impl.super__Rb_tree_header._M_node_count);
  pcVar1 = glu::getGLSLVersionDeclaration(glslVersion);
  poVar2 = std::operator<<((ostream *)&params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           pcVar1);
  std::operator<<(poVar2,"\n");
  std::operator<<((ostream *)&params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                  "precision mediump int;\n");
  std::operator<<((ostream *)&params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                  "layout(location = 0) out mediump vec4 o_color;\n");
  if (fragAccess == INDEXACCESS_DYNAMIC) {
    std::operator<<((ostream *)&params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    "uniform mediump int ui_zero, ui_one, ui_two, ui_three;\n");
  }
  else if (fragAccess == INDEXACCESS_DYNAMIC_LOOP) {
    std::operator<<((ostream *)&params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    "uniform int ui_four;\n");
  }
  std::operator<<((ostream *)&params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                  "in ${PRECISION} ${VAR_TYPE} var[${ARRAY_LEN}];\n");
  std::operator<<((ostream *)&params._M_t._M_impl.super__Rb_tree_header._M_node_count,"\n");
  std::operator<<((ostream *)&params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                  "void main()\n");
  std::operator<<((ostream *)&params._M_t._M_impl.super__Rb_tree_header._M_node_count,"{\n");
  std::operator<<((ostream *)&params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                  "   ${PRECISION} ${VAR_TYPE} res = ${VAR_TYPE}(0.0);\n");
  if (fragAccess == INDEXACCESS_STATIC) {
    std::operator<<((ostream *)&params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    "   res += var[0];\n");
    std::operator<<((ostream *)&params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    "   res += var[1];\n");
    std::operator<<((ostream *)&params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    "   res += var[2];\n");
    std::operator<<((ostream *)&params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    "   res += var[3];\n");
  }
  else if (fragAccess == INDEXACCESS_DYNAMIC) {
    std::operator<<((ostream *)&params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    "   res += var[ui_zero];\n");
    std::operator<<((ostream *)&params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    "   res += var[ui_one];\n");
    std::operator<<((ostream *)&params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    "   res += var[ui_two];\n");
    std::operator<<((ostream *)&params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    "   res += var[ui_three];\n");
  }
  else if (fragAccess == INDEXACCESS_STATIC_LOOP) {
    std::operator<<((ostream *)&params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    "   for (int i = 0; i < 4; i++)\n");
    std::operator<<((ostream *)&params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    "       res += var[i];\n");
  }
  else {
    std::operator<<((ostream *)&params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    "   for (int i = 0; i < ui_four; i++)\n");
    std::operator<<((ostream *)&params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    "       res += var[i];\n");
  }
  std::operator<<((ostream *)&params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                  "   o_color = vec4(res${PADDING});\n");
  std::operator<<((ostream *)&params._M_t._M_impl.super__Rb_tree_header._M_node_count,"}\n");
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_360);
  local_3a8 = glu::getDataTypeName(varType);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[9],_const_char_*,_true>(&local_3a0,(char (*) [9])0x2b3e529,&local_3a8);
  _Var3 = std::
          map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)local_360,&local_3a0);
  local_3b8 = (_Base_ptr)_Var3.first._M_node;
  local_3b0 = _Var3.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_3a0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[10],_const_char_(&)[2],_true>
            (&local_3f8,(char (*) [10])"ARRAY_LEN",(char (*) [2])0x2b7d744);
  _Var3 = std::
          map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)local_360,&local_3f8);
  local_408 = (_Base_ptr)_Var3.first._M_node;
  local_400 = _Var3.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_3f8);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
            (&local_448,(char (*) [10])0x2c6b643,(char (*) [8])0x2b7c54a);
  _Var3 = std::
          map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)local_360,&local_448);
  local_458 = (_Base_ptr)_Var3.first._M_node;
  local_450 = _Var3.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_448);
  if (varType == TYPE_FLOAT) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[8],_const_char_(&)[16],_true>
              (&local_498,(char (*) [8])"PADDING",(char (*) [16])", 0.0, 0.0, 1.0");
    _Var3 = std::
            map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)local_360,&local_498);
    local_4a8 = (_Base_ptr)_Var3.first._M_node;
    local_4a0 = _Var3.second;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_498);
  }
  else if (varType == TYPE_FLOAT_VEC2) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[8],_const_char_(&)[11],_true>
              (&local_4e8,(char (*) [8])"PADDING",(char (*) [11])0x2b3b3ac);
    _Var3 = std::
            map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)local_360,&local_4e8);
    local_4f8 = (_Base_ptr)_Var3.first._M_node;
    local_4f0 = _Var3.second;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_4e8);
  }
  else if (varType == TYPE_FLOAT_VEC3) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[8],_const_char_(&)[6],_true>
              (&local_538,(char (*) [8])"PADDING",(char (*) [6])0x2b3b3b1);
    _Var3 = std::
            map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)local_360,&local_538);
    local_548 = (_Base_ptr)_Var3.first._M_node;
    local_540 = _Var3.second;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_538);
  }
  else {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[8],_const_char_(&)[1],_true>
              (&local_588,(char (*) [8])"PADDING",(char (*) [1])"");
    _Var3 = std::
            map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)local_360,&local_588);
    vertTemplate.m_template.field_2._8_8_ = _Var3.first._M_node;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_588);
  }
  std::__cxx11::ostringstream::str();
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5d8,pcVar1,
             (allocator<char> *)(fragTemplate.m_template.field_2._M_local_buf + 0xf));
  tcu::StringTemplate::StringTemplate((StringTemplate *)local_5b8,&local_5d8);
  std::__cxx11::string::~string((string *)&local_5d8);
  std::allocator<char>::~allocator
            ((allocator<char> *)(fragTemplate.m_template.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string(local_5f8);
  std::__cxx11::ostringstream::str();
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_640,pcVar1,
             (allocator<char> *)(vertexShaderSource.field_2._M_local_buf + 0xf));
  tcu::StringTemplate::StringTemplate((StringTemplate *)local_620,&local_640);
  std::__cxx11::string::~string((string *)&local_640);
  std::allocator<char>::~allocator
            ((allocator<char> *)(vertexShaderSource.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string(local_660);
  tcu::StringTemplate::specialize
            ((string *)((long)&fragmentShaderSource.field_2 + 8),(StringTemplate *)local_5b8,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_360);
  tcu::StringTemplate::specialize
            ((string *)&evalFunc,(StringTemplate *)local_620,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_360);
  evalFunc_00 = getArrayCoordsEvalFunc(varType);
  this = (ShaderIndexingCase *)operator_new(0x130);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  fragShaderSource = (char *)std::__cxx11::string::c_str();
  ShaderIndexingCase::ShaderIndexingCase
            (this,context,caseName,description,true,varType,evalFunc_00,pcVar1,fragShaderSource);
  std::__cxx11::string::~string((string *)&evalFunc);
  std::__cxx11::string::~string((string *)(fragmentShaderSource.field_2._M_local_buf + 8));
  tcu::StringTemplate::~StringTemplate((StringTemplate *)local_620);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)local_5b8);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_360);
  std::__cxx11::ostringstream::~ostringstream
            ((ostringstream *)&params._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  return this;
}

Assistant:

static ShaderIndexingCase* createVaryingArrayCase(Context& context, const char* caseName, const char* description,
												  glu::GLSLVersion glslVersion, DataType varType,
												  IndexAccessType vertAccess, IndexAccessType fragAccess)
{
	DE_ASSERT(glslVersion == glu::GLSL_VERSION_300_ES || glslVersion == glu::GLSL_VERSION_310_ES ||
			  glslVersion >= glu::GLSL_VERSION_330);

	std::ostringstream vtx;
	vtx << glu::getGLSLVersionDeclaration(glslVersion) << "\n";
	vtx << "in highp vec4 a_position;\n";
	vtx << "in highp vec4 a_coords;\n";
	if (vertAccess == INDEXACCESS_DYNAMIC)
		vtx << "uniform mediump int ui_zero, ui_one, ui_two, ui_three;\n";
	else if (vertAccess == INDEXACCESS_DYNAMIC_LOOP)
		vtx << "uniform mediump int ui_four;\n";
	vtx << "out ${PRECISION} ${VAR_TYPE} var[${ARRAY_LEN}];\n";
	vtx << "\n";
	vtx << "void main()\n";
	vtx << "{\n";
	vtx << "    gl_Position = a_position;\n";
	if (vertAccess == INDEXACCESS_STATIC)
	{
		vtx << "    var[0] = ${VAR_TYPE}(a_coords);\n";
		vtx << "    var[1] = ${VAR_TYPE}(a_coords) * 0.5;\n";
		vtx << "    var[2] = ${VAR_TYPE}(a_coords) * 0.25;\n";
		vtx << "    var[3] = ${VAR_TYPE}(a_coords) * 0.125;\n";
	}
	else if (vertAccess == INDEXACCESS_DYNAMIC)
	{
		vtx << "    var[ui_zero]  = ${VAR_TYPE}(a_coords);\n";
		vtx << "    var[ui_one]   = ${VAR_TYPE}(a_coords) * 0.5;\n";
		vtx << "    var[ui_two]   = ${VAR_TYPE}(a_coords) * 0.25;\n";
		vtx << "    var[ui_three] = ${VAR_TYPE}(a_coords) * 0.125;\n";
	}
	else if (vertAccess == INDEXACCESS_STATIC_LOOP)
	{
		vtx << "    ${PRECISION} ${VAR_TYPE} coords = ${VAR_TYPE}(a_coords);\n";
		vtx << "    for (int i = 0; i < 4; i++)\n";
		vtx << "    {\n";
		vtx << "        var[i] = ${VAR_TYPE}(coords);\n";
		vtx << "        coords = coords * 0.5;\n";
		vtx << "    }\n";
	}
	else
	{
		DE_ASSERT(vertAccess == INDEXACCESS_DYNAMIC_LOOP);
		vtx << "    ${PRECISION} ${VAR_TYPE} coords = ${VAR_TYPE}(a_coords);\n";
		vtx << "    for (int i = 0; i < ui_four; i++)\n";
		vtx << "    {\n";
		vtx << "        var[i] = ${VAR_TYPE}(coords);\n";
		vtx << "        coords = coords * 0.5;\n";
		vtx << "    }\n";
	}
	vtx << "}\n";

	std::ostringstream frag;
	frag << glu::getGLSLVersionDeclaration(glslVersion) << "\n";
	frag << "precision mediump int;\n";
	frag << "layout(location = 0) out mediump vec4 o_color;\n";
	if (fragAccess == INDEXACCESS_DYNAMIC)
		frag << "uniform mediump int ui_zero, ui_one, ui_two, ui_three;\n";
	else if (fragAccess == INDEXACCESS_DYNAMIC_LOOP)
		frag << "uniform int ui_four;\n";
	frag << "in ${PRECISION} ${VAR_TYPE} var[${ARRAY_LEN}];\n";
	frag << "\n";
	frag << "void main()\n";
	frag << "{\n";
	frag << "   ${PRECISION} ${VAR_TYPE} res = ${VAR_TYPE}(0.0);\n";
	if (fragAccess == INDEXACCESS_STATIC)
	{
		frag << "   res += var[0];\n";
		frag << "   res += var[1];\n";
		frag << "   res += var[2];\n";
		frag << "   res += var[3];\n";
	}
	else if (fragAccess == INDEXACCESS_DYNAMIC)
	{
		frag << "   res += var[ui_zero];\n";
		frag << "   res += var[ui_one];\n";
		frag << "   res += var[ui_two];\n";
		frag << "   res += var[ui_three];\n";
	}
	else if (fragAccess == INDEXACCESS_STATIC_LOOP)
	{
		frag << "   for (int i = 0; i < 4; i++)\n";
		frag << "       res += var[i];\n";
	}
	else
	{
		DE_ASSERT(fragAccess == INDEXACCESS_DYNAMIC_LOOP);
		frag << "   for (int i = 0; i < ui_four; i++)\n";
		frag << "       res += var[i];\n";
	}
	frag << "   o_color = vec4(res${PADDING});\n";
	frag << "}\n";

	// Fill in shader templates.
	map<string, string> params;
	params.insert(pair<string, string>("VAR_TYPE", getDataTypeName(varType)));
	params.insert(pair<string, string>("ARRAY_LEN", "4"));
	params.insert(pair<string, string>("PRECISION", "mediump"));

	if (varType == TYPE_FLOAT)
		params.insert(pair<string, string>("PADDING", ", 0.0, 0.0, 1.0"));
	else if (varType == TYPE_FLOAT_VEC2)
		params.insert(pair<string, string>("PADDING", ", 0.0, 1.0"));
	else if (varType == TYPE_FLOAT_VEC3)
		params.insert(pair<string, string>("PADDING", ", 1.0"));
	else
		params.insert(pair<string, string>("PADDING", ""));

	StringTemplate vertTemplate(vtx.str().c_str());
	StringTemplate fragTemplate(frag.str().c_str());
	string		   vertexShaderSource   = vertTemplate.specialize(params);
	string		   fragmentShaderSource = fragTemplate.specialize(params);

	ShaderEvalFunc evalFunc = getArrayCoordsEvalFunc(varType);
	return new ShaderIndexingCase(context, caseName, description, true, varType, evalFunc, vertexShaderSource.c_str(),
								  fragmentShaderSource.c_str());
}